

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_set_icc(LodePNGInfo *info,char *name,uchar *profile,uint profile_size)

{
  char *__ptr;
  uchar *__dest;
  uint uVar1;
  
  if (info->iccp_defined != 0) {
    free(info->iccp_name);
    info->iccp_name = (char *)0x0;
    free(info->iccp_profile);
    info->iccp_profile = (uchar *)0x0;
    info->iccp_profile_size = 0;
    info->iccp_defined = 0;
  }
  if (profile_size == 0) {
    uVar1 = 100;
  }
  else {
    __ptr = alloc_string(name);
    info->iccp_name = __ptr;
    uVar1 = 0x53;
    if (__ptr != (char *)0x0) {
      __dest = (uchar *)malloc((ulong)profile_size);
      info->iccp_profile = __dest;
      if (__dest == (uchar *)0x0) {
        free(__ptr);
      }
      else {
        memcpy(__dest,profile,(ulong)profile_size);
        info->iccp_profile_size = profile_size;
        info->iccp_defined = 1;
        uVar1 = 0;
      }
    }
  }
  return uVar1;
}

Assistant:

unsigned lodepng_set_icc(LodePNGInfo* info, const char* name, const unsigned char* profile, unsigned profile_size) {
  if(info->iccp_defined) lodepng_clear_icc(info);

  if(profile_size == 0) return 100; /*invalid ICC profile size*/

  info->iccp_name = alloc_string(name);
  if(!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_profile = (unsigned char*)lodepng_malloc(profile_size);
  if(!info->iccp_profile) {
    lodepng_free(info->iccp_name);
    return 83; /*alloc fail*/
  }

  lodepng_memcpy(info->iccp_profile, profile, profile_size);
  info->iccp_profile_size = profile_size;
  info->iccp_defined = 1;

  return 0; /*ok*/
}